

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O2

PathList_t *
Kumu::FindInPaths(IPathMatch *Pattern,PathList_t *SearchPaths,PathList_t *FoundPaths,bool one_shot,
                 char separator)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)SearchPaths;
  do {
    p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)SearchPaths) {
      return FoundPaths;
    }
    FindInPath(Pattern,(string *)(p_Var1 + 1),FoundPaths,one_shot,separator);
  } while ((!one_shot) ||
          ((FoundPaths->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)FoundPaths));
  return FoundPaths;
}

Assistant:

Kumu::PathList_t&
Kumu::FindInPaths(const IPathMatch& Pattern, const Kumu::PathList_t& SearchPaths,
		  Kumu::PathList_t& FoundPaths, bool one_shot, char separator)
{
  PathList_t::const_iterator si;
  for ( si = SearchPaths.begin(); si != SearchPaths.end(); si++ )
    {
      FindInPath(Pattern, *si, FoundPaths, one_shot, separator);

      if ( one_shot && ! FoundPaths.empty() )
	break;
    }

  return FoundPaths;
}